

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O1

Gia_Man_t *
Gia_ManResub1(char *pFileName,int nNodes,int nSupp,int nDivs,int iChoice,int fUseXor,int fVerbose,
             int fVeryVerbose)

{
  Vec_Int_t *pVVar1;
  void *__ptr;
  bool bVar2;
  char cVar3;
  int iVar4;
  FILE *__stream;
  Vec_Wrd_t *vSims;
  word *pwVar5;
  Vec_Ptr_t *vDivs;
  Gia_ResbMan_t *p;
  Vec_Wec_t *vFuncs;
  Vec_Int_t *p_00;
  Gia_Man_t *pGVar6;
  ulong Entry;
  long lVar7;
  int iVar8;
  long lVar9;
  uint nWords;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    nWords = 0;
    printf("Cannot open file \"%s\" for reading.\n",pFileName);
    vSims = (Vec_Wrd_t *)0x0;
LAB_007a03e6:
    if (vSims == (Vec_Wrd_t *)0x0) {
      vDivs = (Vec_Ptr_t *)0x0;
    }
    else {
      vDivs = Gia_ManDeriveDivs(vSims,nWords);
    }
    p = Gia_ResbAlloc(nWords);
    if (0x3fff < vDivs->nSize) {
      printf("Reducing all divs from %d to %d.\n",(ulong)(uint)vDivs->nSize,0x3fff);
      if (vDivs->nSize < 0x3fff) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
      }
      vDivs->nSize = 0x3fff;
    }
    if (0x3fff < vDivs->nSize) {
      __assert_fail("Vec_PtrSize(vDivs) < (1<<14)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                    ,0x661,"Gia_Man_t *Gia_ManResub1(char *, int, int, int, int, int, int, int)");
    }
    Gia_ManResubPerform(p,vDivs,nWords,100,0x32,iChoice,fUseXor,1,1);
    pVVar1 = p->vGates;
    iVar8 = pVVar1->nSize;
    if (iVar8 == 0) {
      puts("Decomposition did not succeed.");
      pGVar6 = (Gia_Man_t *)0x0;
    }
    else {
      vFuncs = (Vec_Wec_t *)malloc(0x10);
      vFuncs->nCap = 8;
      vFuncs->nSize = 0;
      lVar9 = 8;
      p_00 = (Vec_Int_t *)calloc(8,0x10);
      vFuncs->pArray = p_00;
      vFuncs->nSize = 1;
      if (0 < iVar8) {
        lVar7 = 0;
        do {
          Vec_IntPush(p_00,pVVar1->pArray[lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 < pVVar1->nSize);
      }
      pGVar6 = Gia_ManConstructFromGates(vFuncs,vDivs->nSize);
      do {
        __ptr = *(void **)((long)&p_00->nCap + lVar9);
        if (__ptr != (void *)0x0) {
          free(__ptr);
          *(undefined8 *)((long)&p_00->nCap + lVar9) = 0;
        }
        lVar9 = lVar9 + 0x10;
      } while (lVar9 != 0x88);
      if (p_00 != (Vec_Int_t *)0x0) {
        free(p_00);
        vFuncs->pArray = (Vec_Int_t *)0x0;
      }
      vFuncs->nCap = 0;
      vFuncs->nSize = 0;
      free(vFuncs);
    }
    Gia_ResbFree(p);
    if (vDivs->pArray != (void **)0x0) {
      free(vDivs->pArray);
      vDivs->pArray = (void **)0x0;
    }
    if (vDivs != (Vec_Ptr_t *)0x0) {
      free(vDivs);
    }
    if (vSims->pArray != (word *)0x0) {
      free(vSims->pArray);
      vSims->pArray = (word *)0x0;
    }
    if (vSims != (Vec_Wrd_t *)0x0) {
      free(vSims);
    }
    return pGVar6;
  }
  vSims = (Vec_Wrd_t *)malloc(0x10);
  vSims->nCap = 1000;
  vSims->nSize = 0;
  pwVar5 = (word *)malloc(8000);
  vSims->pArray = pwVar5;
  iVar8 = 0;
  nWords = 0xffffffff;
  Entry = 0;
LAB_007a02de:
  do {
    iVar4 = fgetc(__stream);
    if (iVar4 < 0xd) goto LAB_007a02f7;
  } while ((iVar4 == 0xd) || (iVar4 == 0x20));
  goto LAB_007a030a;
LAB_007a02f7:
  if (iVar4 != 9) {
    if (iVar4 == -1) {
      iVar8 = vSims->nSize;
      if (iVar8 % (int)nWords != 0) {
        __assert_fail("Vec_WrdSize(p) % nWords == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x52c,"Vec_Wrd_t *Vec_WrdReadHex(char *, int *, int)");
      }
      fclose(__stream);
      printf("Read %d words of simulation data for %d objects.\n",(ulong)nWords,
             (long)iVar8 / (long)(int)nWords & 0xffffffff);
      goto LAB_007a03e6;
    }
    if (iVar4 == 10) {
      if (0 < iVar8) {
        Vec_WrdPush(vSims,Entry);
        iVar8 = 0;
        Entry = 0;
      }
      if ((nWords == 0xffffffff) && (nWords = vSims->nSize, (int)nWords < 1)) {
        nWords = 0xffffffff;
      }
    }
    else {
LAB_007a030a:
      cVar3 = (char)iVar4;
      iVar4 = -0x30;
      if ((9 < (byte)(cVar3 - 0x30U)) &&
         ((iVar4 = -0x37, 5 < (byte)(cVar3 + 0xbfU) && (iVar4 = -0x57, 5 < (byte)(cVar3 + 0x9fU)))))
      {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x506,"int Vec_WrdReadHexOne(char)");
      }
      Entry = (ulong)(uint)(cVar3 + iVar4) << ((char)iVar8 * '\x04' & 0x3fU) | Entry;
      bVar2 = 0xe < iVar8;
      iVar8 = iVar8 + 1;
      if (bVar2) {
        Vec_WrdPush(vSims,Entry);
        iVar8 = 0;
        Entry = 0;
      }
    }
  }
  goto LAB_007a02de;
}

Assistant:

Gia_Man_t * Gia_ManResub1( char * pFileName, int nNodes, int nSupp, int nDivs, int iChoice, int fUseXor, int fVerbose, int fVeryVerbose )
{
    int nWords = 0;
    Gia_Man_t * pMan   = NULL;
    Vec_Wrd_t * vSims  = Vec_WrdReadHex( pFileName, &nWords, 1 );
    Vec_Ptr_t * vDivs  = vSims ? Gia_ManDeriveDivs( vSims, nWords ) : NULL;
    Gia_ResbMan_t * p = Gia_ResbAlloc( nWords );
    //Gia_ManCheckResub( vDivs, nWords );
    if ( Vec_PtrSize(vDivs) >= (1<<14) )
    {
        printf( "Reducing all divs from %d to %d.\n", Vec_PtrSize(vDivs), (1<<14)-1 );
        Vec_PtrShrink( vDivs, (1<<14)-1 );
    }
    assert( Vec_PtrSize(vDivs) < (1<<14) );
    Gia_ManResubPerform( p, vDivs, nWords, 100, 50, iChoice, fUseXor, 1, 1 );
    if ( Vec_IntSize(p->vGates) )
    {
        Vec_Wec_t * vGates = Vec_WecStart(1);
        Vec_IntAppend( Vec_WecEntry(vGates, 0), p->vGates );
        pMan = Gia_ManConstructFromGates( vGates, Vec_PtrSize(vDivs) );
        Vec_WecFree( vGates );
    }
    else
        printf( "Decomposition did not succeed.\n" );
    Gia_ResbFree( p );
    Vec_PtrFree( vDivs );
    Vec_WrdFree( vSims );
    return pMan;
}